

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O1

void __thiscall deqp::egl::anon_unknown_0::MemoryAllocator::allocateContext(MemoryAllocator *this)

{
  pointer *pppvVar1;
  Random *rnd;
  iterator __position;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> first;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> last;
  void *pvVar2;
  deUint32 dVar3;
  int iVar4;
  GLenum GVar5;
  Library *pLVar6;
  undefined4 extraout_var;
  EGLContext context;
  EGLint attribList [3];
  void *val;
  void *local_50;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  undefined8 local_38;
  undefined4 local_30;
  void *local_28;
  
  std::vector<void_*,_std::allocator<void_*>_>::reserve
            (&this->m_contexts,
             ((long)(this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pLVar6 = EglTestContext::getLibrary(this->m_eglTestCtx);
  local_38 = 0x200003098;
  local_30 = 0x3038;
  (**pLVar6->_vptr_Library)(pLVar6,0x30a0);
  dVar3 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  eglu::checkError(dVar3,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                   ,0x110);
  iVar4 = (*pLVar6->_vptr_Library[6])(pLVar6,this->m_display,this->m_config,0,&local_38);
  local_50 = (void *)CONCAT44(extraout_var,iVar4);
  dVar3 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  eglu::checkError(dVar3,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                   ,0x112);
  __position._M_current =
       (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
              ((vector<void*,std::allocator<void*>> *)&this->m_contexts,__position,&local_50);
  }
  else {
    *__position._M_current = local_50;
    pppvVar1 = &(this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  if (this->m_use == true) {
    first._M_current =
         (this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    last._M_current =
         (this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (last._M_current != first._M_current) {
      rnd = &this->m_rnd;
      local_28 = (void *)0x0;
      de::Random::
      choose<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>,void**>
                (rnd,first,last,&local_28,1);
      pvVar2 = local_28;
      local_3c = deRandom_getFloat(&rnd->m_rnd);
      local_40 = deRandom_getFloat(&rnd->m_rnd);
      local_44 = deRandom_getFloat(&rnd->m_rnd);
      local_48 = deRandom_getFloat(&rnd->m_rnd);
      (*pLVar6->_vptr_Library[0x27])(pLVar6,this->m_display,pvVar2,pvVar2,local_50);
      dVar3 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar3,"makeCurrent(m_display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0x120);
      (*(this->m_gl).clearColor)(local_3c,local_40,local_44,local_48);
      GVar5 = (*(this->m_gl).getError)();
      glu::checkError(GVar5,"glClearColor()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                      ,0x123);
      (*(this->m_gl).clear)(0x4000);
      GVar5 = (*(this->m_gl).getError)();
      glu::checkError(GVar5,"glClear()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                      ,0x126);
      (*pLVar6->_vptr_Library[0x27])(pLVar6,this->m_display,0,0,0);
      dVar3 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar3,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0x128);
    }
  }
  return;
}

Assistant:

void MemoryAllocator::allocateContext (void)
{
	// Reserve space for new allocations
	try
	{
		m_contexts.reserve(m_contexts.size() + 1);
	}
	catch (const std::bad_alloc&)
	{
		m_errorString	= "std::bad_alloc when allocating more space for testcase. Out of host memory.";
		m_failed		= true;
		return;
	}

	// Allocate context
	try
	{
		const Library&	egl				= m_eglTestCtx.getLibrary();
		const EGLint	attribList[]	=
		{
			EGL_CONTEXT_CLIENT_VERSION, 2,
			EGL_NONE
		};

		EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));
		EGLContext context = egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attribList);
		EGLU_CHECK_MSG(egl, "eglCreateContext");

		DE_ASSERT(context != EGL_NO_CONTEXT);

		m_contexts.push_back(context);

		if (m_use && m_pbuffers.size() > 0)
		{
			EGLSurface				surface		= m_rnd.choose<EGLSurface>(m_pbuffers.begin(), m_pbuffers.end());
			const float				red			= m_rnd.getFloat();
			const float				green		= m_rnd.getFloat();
			const float				blue		= m_rnd.getFloat();
			const float				alpha		= m_rnd.getFloat();

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, surface, surface, context));

			m_gl.clearColor(red, green, blue, alpha);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearColor()");

			m_gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClear()");

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		}
	}
	catch (const eglu::Error& error)
	{
		if (error.getError() == EGL_BAD_ALLOC)
		{
			m_errorString	= "eglCreateContext returned EGL_BAD_ALLOC";
			m_failed		= true;
			return;
		}
		else
			throw;
	}
}